

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error uimm_extended(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  uint64_t in_RCX;
  token local_70;
  uint local_48;
  byte local_31;
  ulong local_30;
  uint64_t value;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_31 = 0;
  value = in_RCX;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  convert_integer((token *)ctx,(int64_t)op,0,
                  (uint64_t *)&std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_31 = 1;
  }
  local_48 = (uint)bVar1;
  if ((local_31 & 1) == 0) {
    error::~error((error *)ctx);
  }
  if (local_48 == 0) {
    if (0x7ffff < local_30) {
      local_30 = local_30 - 0x80000;
      opcode::add_bits((opcode *)value,0x100000000000000);
    }
    opcode::add_bits((opcode *)value,local_30 << 0x14);
    context::tokenize(&local_70,(context *)token_local);
    memcpy(op_local,&local_70,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(uimm_extended)
{
    uint64_t value;
    CHECK(convert_integer(token, 0, 1ULL << 20, &value));
    if (value >= 0x80000) {
        value -= 0x80000;
        op.add_bits(1ULL << 56);
    }
    op.add_bits(value << 20);
    token = ctx.tokenize();
    return {};
}